

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableEndCell(ImGuiTable *table)

{
  long lVar1;
  ImGuiTableColumn *pIVar2;
  long in_RDI;
  float fVar3;
  float *p_max_pos_x;
  ImGuiWindow *window;
  ImGuiTableColumn *column;
  float *local_28;
  float *local_20;
  
  pIVar2 = ImSpan<ImGuiTableColumn>::operator[]
                     ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),*(int *)(in_RDI + 0x7c));
  lVar1 = *(long *)(in_RDI + 400);
  if ((*(uint *)(in_RDI + 0x98) & 1) == 0) {
    if ((*(byte *)(in_RDI + 0x204) & 1) == 0) {
      local_28 = &pIVar2->ContentMaxXFrozen;
    }
    else {
      local_28 = &pIVar2->ContentMaxXUnfrozen;
    }
    local_20 = local_28;
  }
  else {
    local_20 = &pIVar2->ContentMaxXHeadersUsed;
  }
  fVar3 = ImMax<float>(*local_20,*(float *)(lVar1 + 0xf0));
  *local_20 = fVar3;
  fVar3 = ImMax<float>(*(float *)(in_RDI + 0x88),*(float *)(lVar1 + 0xf4) + *(float *)(in_RDI + 200)
                      );
  *(float *)(in_RDI + 0x88) = fVar3;
  pIVar2->ItemWidth = *(float *)(lVar1 + 0x194);
  fVar3 = ImMax<float>(*(float *)(in_RDI + 0x90),*(float *)(lVar1 + 0x114));
  *(float *)(in_RDI + 0x90) = fVar3;
  return;
}

Assistant:

void ImGui::TableEndCell(ImGuiTable* table)
{
    ImGuiTableColumn* column = &table->Columns[table->CurrentColumn];
    ImGuiWindow* window = table->InnerWindow;

    // Report maximum position so we can infer content size per column.
    float* p_max_pos_x;
    if (table->RowFlags & ImGuiTableRowFlags_Headers)
        p_max_pos_x = &column->ContentMaxXHeadersUsed;  // Useful in case user submit contents in header row that is not a TableHeader() call
    else
        p_max_pos_x = table->IsUnfrozenRows ? &column->ContentMaxXUnfrozen : &column->ContentMaxXFrozen;
    *p_max_pos_x = ImMax(*p_max_pos_x, window->DC.CursorMaxPos.x);
    table->RowPosY2 = ImMax(table->RowPosY2, window->DC.CursorMaxPos.y + table->CellPaddingY);
    column->ItemWidth = window->DC.ItemWidth;

    // Propagate text baseline for the entire row
    // FIXME-TABLE: Here we propagate text baseline from the last line of the cell.. instead of the first one.
    table->RowTextBaseline = ImMax(table->RowTextBaseline, window->DC.PrevLineTextBaseOffset);
}